

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_column_writer.cpp
# Opt level: O0

void __thiscall
duckdb::PrimitiveColumnWriter::RegisterToRowGroup(PrimitiveColumnWriter *this,RowGroup *row_group)

{
  type tVar1;
  ColumnWriter *in_RDI;
  ColumnChunk column_chunk;
  value_type *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  
  duckdb_parquet::ColumnChunk::ColumnChunk
            ((ColumnChunk *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  ParquetWriter::GetCodec(in_RDI->writer);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)in_stack_fffffffffffffd38);
  ColumnWriter::SchemaIndex(in_RDI);
  tVar1 = ParquetWriter::GetType
                    ((ParquetWriter *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                     (idx_t)in_stack_fffffffffffffd38);
  ::std::vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>::
  push_back((vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_> *)
            CONCAT44(tVar1,in_stack_fffffffffffffd40),in_stack_fffffffffffffd38);
  duckdb_parquet::ColumnChunk::~ColumnChunk
            ((ColumnChunk *)CONCAT44(tVar1,in_stack_fffffffffffffd40));
  return;
}

Assistant:

void PrimitiveColumnWriter::RegisterToRowGroup(duckdb_parquet::RowGroup &row_group) {
	duckdb_parquet::ColumnChunk column_chunk;
	column_chunk.__isset.meta_data = true;
	column_chunk.meta_data.codec = writer.GetCodec();
	column_chunk.meta_data.path_in_schema = schema_path;
	column_chunk.meta_data.num_values = 0;
	column_chunk.meta_data.type = writer.GetType(SchemaIndex());
	row_group.columns.push_back(std::move(column_chunk));
}